

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrusive-list.h
# Opt level: O2

Result __thiscall
wabt::anon_unknown_1::WatWriter::ExprVisitorDelegate::AfterIfTrueExpr
          (ExprVisitorDelegate *this,IfExpr *expr)

{
  int *piVar1;
  WatWriter *pWVar2;
  char *s;
  
  if ((expr->false_).size_ != 0) {
    Dedent(this->writer_);
    pWVar2 = this->writer_;
    s = Opcode::GetName((Opcode *)&Opcode::Else_Opcode);
    WritePutsSpace(pWVar2,s);
    pWVar2 = this->writer_;
    piVar1 = &pWVar2->indent_;
    *piVar1 = *piVar1 + 2;
    WriteNewline(pWVar2,true);
  }
  return (Result)Ok;
}

Assistant:

inline bool intrusive_list<T>::empty() const noexcept {
  return size_ == 0;
}